

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_vsnprintf(int n,char *zBuf,char *zFormat,__va_list_tag *ap)

{
  long in_FS_OFFSET;
  sqlite3_str local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.nChar = 0xaaaaaaaa;
  local_38.accError = 0xaa;
  local_38.printfFlags = 0xaa;
  local_38._30_2_ = 0xaaaa;
  if (0 < n) {
    local_38.db = (sqlite3 *)0x0;
    local_38.mxAlloc = 0;
    local_38.nChar = 0;
    local_38.accError = '\0';
    local_38.printfFlags = '\0';
    local_38.zText = zBuf;
    local_38.nAlloc = n;
    sqlite3_str_vappendf(&local_38,zFormat,ap);
    zBuf[local_38.nChar] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return zBuf;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API char *sqlite3_vsnprintf(int n, char *zBuf, const char *zFormat, va_list ap){
  StrAccum acc;
  if( n<=0 ) return zBuf;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( zBuf==0 || zFormat==0 ) {
    (void)SQLITE_MISUSE_BKPT;
    if( zBuf ) zBuf[0] = 0;
    return zBuf;
  }
#endif
  sqlite3StrAccumInit(&acc, 0, zBuf, n, 0);
  sqlite3_str_vappendf(&acc, zFormat, ap);
  zBuf[acc.nChar] = 0;
  return zBuf;
}